

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListRecordingsRequest.h
# Opt level: O2

void __thiscall
io::aeron::archive::codecs::ListRecordingsRequest::sbePosition
          (ListRecordingsRequest *this,uint64_t position)

{
  runtime_error *this_00;
  
  if (position <= this->m_bufferLength) {
    this->m_position = position;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"buffer too short [E100]");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void sbePosition(const std::uint64_t position)
    {
        if (SBE_BOUNDS_CHECK_EXPECT((position > m_bufferLength), false))
        {
            throw std::runtime_error("buffer too short [E100]");
        }
        m_position = position;
    }